

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SstReader.cpp
# Opt level: O0

void __thiscall adios2::core::engine::SstReader::BP5PerformGets(SstReader *this)

{
  bool bVar1;
  SstStatusValue SVar2;
  SstStream in_RDI;
  void **i;
  iterator __end2_1;
  iterator __begin2_1;
  vector<void_*,_std::allocator<void_*>_> *__range2_1;
  void *ret;
  void *dp_info;
  ReadRequest *Req;
  iterator __end2;
  iterator __begin2;
  vector<adios2::format::BP5Deserializer::ReadRequest,_std::allocator<adios2::format::BP5Deserializer::ReadRequest>_>
  *__range2;
  vector<void_*,_std::allocator<void_*>_> sstReadHandlers;
  vector<adios2::format::BP5Deserializer::ReadRequest,_std::allocator<adios2::format::BP5Deserializer::ReadRequest>_>
  ReadRequests;
  size_t maxReadSize;
  size_t *in_stack_000004a8;
  bool in_stack_000004b7;
  BP5Deserializer *in_stack_000004b8;
  SstStream in_stack_fffffffffffffe78;
  __normal_iterator<adios2::format::BP5Deserializer::ReadRequest_*,_std::vector<adios2::format::BP5Deserializer::ReadRequest,_std::allocator<adios2::format::BP5Deserializer::ReadRequest>_>_>
  *in_stack_fffffffffffffe80;
  value_type *in_stack_fffffffffffffe88;
  allocator *paVar3;
  allocator *in_stack_fffffffffffffe90;
  allocator *in_stack_fffffffffffffe98;
  BP5Deserializer *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  void *in_stack_fffffffffffffeb0;
  int Rank;
  int in_stack_fffffffffffffec4;
  string *in_stack_fffffffffffffec8;
  string *in_stack_fffffffffffffed0;
  string *in_stack_fffffffffffffed8;
  string *in_stack_fffffffffffffee0;
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [39];
  undefined1 local_c1 [33];
  reference local_a0;
  void **local_98;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> local_90;
  undefined1 *local_88;
  void *local_70;
  SstStream local_68;
  reference local_60;
  ReadRequest *local_58;
  __normal_iterator<adios2::format::BP5Deserializer::ReadRequest_*,_std::vector<adios2::format::BP5Deserializer::ReadRequest,_std::allocator<adios2::format::BP5Deserializer::ReadRequest>_>_>
  local_50;
  undefined1 *local_48;
  undefined1 local_40 [24];
  undefined1 local_28 [40];
  
  adios2::format::BP5Deserializer::GenerateReadRequests
            (in_stack_000004b8,in_stack_000004b7,in_stack_000004a8);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)0xe703ca);
  local_48 = local_28;
  local_50._M_current =
       (ReadRequest *)
       std::
       vector<adios2::format::BP5Deserializer::ReadRequest,_std::allocator<adios2::format::BP5Deserializer::ReadRequest>_>
       ::begin((vector<adios2::format::BP5Deserializer::ReadRequest,_std::allocator<adios2::format::BP5Deserializer::ReadRequest>_>
                *)in_stack_fffffffffffffe78);
  local_58 = (ReadRequest *)
             std::
             vector<adios2::format::BP5Deserializer::ReadRequest,_std::allocator<adios2::format::BP5Deserializer::ReadRequest>_>
             ::end((vector<adios2::format::BP5Deserializer::ReadRequest,_std::allocator<adios2::format::BP5Deserializer::ReadRequest>_>
                    *)in_stack_fffffffffffffe78);
  while( true ) {
    Rank = (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffe80,
                       (__normal_iterator<adios2::format::BP5Deserializer::ReadRequest_*,_std::vector<adios2::format::BP5Deserializer::ReadRequest,_std::allocator<adios2::format::BP5Deserializer::ReadRequest>_>_>
                        *)in_stack_fffffffffffffe78);
    if (!bVar1) break;
    local_60 = __gnu_cxx::
               __normal_iterator<adios2::format::BP5Deserializer::ReadRequest_*,_std::vector<adios2::format::BP5Deserializer::ReadRequest,_std::allocator<adios2::format::BP5Deserializer::ReadRequest>_>_>
               ::operator*(&local_50);
    local_68 = (SstStream)0x0;
    if ((in_RDI->DataLock).__data.__list.__prev[1].__prev != (__pthread_internal_list *)0x0) {
      local_68 = (SstStream)
                 (&((in_RDI->DataLock).__data.__list.__prev[1].__prev)->__prev)
                 [local_60->WriterRank];
    }
    in_stack_fffffffffffffe78 = local_68;
    in_stack_fffffffffffffeb0 =
         SstReadRemoteMemory(in_RDI,Rank,
                             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                             (size_t)in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98,
                             in_stack_fffffffffffffe90,in_stack_fffffffffffffed0);
    local_70 = in_stack_fffffffffffffeb0;
    std::vector<void_*,_std::allocator<void_*>_>::push_back
              ((vector<void_*,_std::allocator<void_*>_> *)in_stack_fffffffffffffe90,
               in_stack_fffffffffffffe88);
    __gnu_cxx::
    __normal_iterator<adios2::format::BP5Deserializer::ReadRequest_*,_std::vector<adios2::format::BP5Deserializer::ReadRequest,_std::allocator<adios2::format::BP5Deserializer::ReadRequest>_>_>
    ::operator++(&local_50);
  }
  local_88 = local_40;
  local_90._M_current =
       (void **)std::vector<void_*,_std::allocator<void_*>_>::begin
                          ((vector<void_*,_std::allocator<void_*>_> *)in_stack_fffffffffffffe78);
  local_98 = (void **)std::vector<void_*,_std::allocator<void_*>_>::end
                                ((vector<void_*,_std::allocator<void_*>_> *)
                                 in_stack_fffffffffffffe78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> *)
                       in_stack_fffffffffffffe80,
                       (__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> *)
                       in_stack_fffffffffffffe78);
    if (!bVar1) break;
    local_a0 = __gnu_cxx::__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>
               ::operator*(&local_90);
    SVar2 = SstWaitForCompletion(in_stack_fffffffffffffe78,(void *)0xe7059e);
    if (SVar2 != SstSuccess) {
      in_stack_fffffffffffffea0 = (BP5Deserializer *)local_c1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_c1 + 1),"Engine",(allocator *)in_stack_fffffffffffffea0);
      in_stack_fffffffffffffe98 = &local_e9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e8,"SstReader",in_stack_fffffffffffffe98);
      in_stack_fffffffffffffe90 = &local_111;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_110,"BP5PerformGets",in_stack_fffffffffffffe90);
      paVar3 = (allocator *)&stack0xfffffffffffffec7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffec8,"Writer failed before returning data",paVar3);
      helper::Throw<std::runtime_error>
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                 in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffec8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffec7);
      std::__cxx11::string::~string(local_110);
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
      std::__cxx11::string::~string((string *)(local_c1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_c1);
    }
    __gnu_cxx::__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>::operator++
              (&local_90);
  }
  adios2::format::BP5Deserializer::FinalizeGets
            (in_stack_fffffffffffffea0,
             (vector<adios2::format::BP5Deserializer::ReadRequest,_std::allocator<adios2::format::BP5Deserializer::ReadRequest>_>
              *)in_stack_fffffffffffffe98);
  adios2::format::BP5Deserializer::ClearGetState((BP5Deserializer *)0xe707ee);
  std::vector<void_*,_std::allocator<void_*>_>::~vector
            ((vector<void_*,_std::allocator<void_*>_> *)in_stack_fffffffffffffe90);
  std::
  vector<adios2::format::BP5Deserializer::ReadRequest,_std::allocator<adios2::format::BP5Deserializer::ReadRequest>_>
  ::~vector((vector<adios2::format::BP5Deserializer::ReadRequest,_std::allocator<adios2::format::BP5Deserializer::ReadRequest>_>
             *)in_stack_fffffffffffffe90);
  return;
}

Assistant:

void SstReader::BP5PerformGets()
{
    size_t maxReadSize;
    auto ReadRequests = m_BP5Deserializer->GenerateReadRequests(true, &maxReadSize);
    std::vector<void *> sstReadHandlers;
    for (const auto &Req : ReadRequests)
    {
        void *dp_info = NULL;
        if (m_CurrentStepMetaData->DP_TimestepInfo)
        {
            dp_info = m_CurrentStepMetaData->DP_TimestepInfo[Req.WriterRank];
        }
        auto ret = SstReadRemoteMemory(m_Input, (int)Req.WriterRank, Req.Timestep, Req.StartOffset,
                                       Req.ReadLength, Req.DestinationAddr, dp_info);
        sstReadHandlers.push_back(ret);
    }
    for (const auto &i : sstReadHandlers)
    {
        if (SstWaitForCompletion(m_Input, i) != SstSuccess)
        {
            helper::Throw<std::runtime_error>("Engine", "SstReader", "BP5PerformGets",
                                              "Writer failed before returning data");
        }
    }

    m_BP5Deserializer->FinalizeGets(ReadRequests);
    m_BP5Deserializer->ClearGetState();
}